

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O0

pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> * __thiscall
OpenMD::Ellipsoid::getBoundingBox(Ellipsoid *this)

{
  long in_RSI;
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *in_RDI;
  Vector3d r;
  RealType rad;
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *boundary;
  double in_stack_ffffffffffffff78;
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *in_stack_ffffffffffffff80;
  Vector<double,_3U> *v2;
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *this_00;
  
  this_00 = in_RDI;
  std::pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_>::
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>,_true>(in_stack_ffffffffffffff80);
  if (*(double *)(in_RSI + 0x40) < *(double *)(in_RSI + 0x48) ||
      *(double *)(in_RSI + 0x40) == *(double *)(in_RSI + 0x48)) {
    v2 = *(Vector<double,_3U> **)(in_RSI + 0x48);
  }
  else {
    v2 = *(Vector<double,_3U> **)(in_RSI + 0x40);
  }
  Vector3<double>::Vector3(&this_00->first,(double)in_RDI,(double)v2,in_stack_ffffffffffffff78);
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,v2);
  Vector3<double>::operator=(&in_RDI->first,v2);
  OpenMD::operator+((Vector<double,_3U> *)in_RDI,v2);
  Vector3<double>::operator=(&in_RDI->first,v2);
  return this_00;
}

Assistant:

std::pair<Vector3d, Vector3d> Ellipsoid::getBoundingBox() {
    std::pair<Vector3d, Vector3d> boundary;
    // make a cubic box
    RealType rad = rAxial_ > rEquatorial_ ? rAxial_ : rEquatorial_;
    Vector3d r(rad, rad, rad);
    boundary.first  = origin_ - r;
    boundary.second = origin_ + r;
    return boundary;
  }